

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O2

void fsnav_linal_uuT(double *res,double *u,size_t n)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  
  lVar5 = n * 2;
  lVar11 = 0;
  lVar1 = 0;
  pdVar7 = u;
  for (sVar3 = 0; lVar5 = lVar5 + -2, sVar3 != n; sVar3 = sVar3 + 1) {
    pdVar9 = u + lVar1;
    sVar2 = sVar3;
    lVar6 = lVar5;
    pdVar8 = pdVar7;
    lVar10 = lVar11;
    while (sVar2 != n) {
      dVar12 = u[lVar1] * u[((~sVar2 + n * 2) * sVar2 >> 1) + sVar2];
      res[lVar1] = dVar12;
      for (lVar4 = 1; lVar4 + sVar2 < n; lVar4 = lVar4 + 1) {
        dVar12 = dVar12 + pdVar9[lVar4] * *(double *)((long)pdVar8 + lVar4 * 8 + lVar10 * 4);
        res[lVar1] = dVar12;
      }
      pdVar8 = pdVar8 + 1;
      lVar10 = lVar10 + lVar6;
      lVar6 = lVar6 + -2;
      pdVar9 = pdVar9 + 1;
      lVar1 = lVar1 + 1;
      sVar2 = sVar2 + 1;
    }
    pdVar7 = pdVar7 + 1;
    lVar11 = lVar11 + lVar5;
  }
  return;
}

Assistant:

void fsnav_linal_uuT(double* res, double* u, const size_t n)
{
	size_t i, j, k, p, q, r;

	for (i = 0, k = 0; i < n; i++) {
		for (j = i; j < n; j++, k++) {
			fsnav_linal_u_ij2k(&p, j, j, n);
			res[k] = u[k]*u[p];
			for (q = k+1, p++, r = j+1; r < n; q++, p++, r++)
				res[k] += u[q]*u[p];
		}
	}
}